

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O0

int32 feat_read_lda(feat_t *feat,char *ldafile,int32 dim)

{
  int32 iVar1;
  int iVar2;
  void ***local_60;
  void ***outlda;
  char **argval;
  char **argname;
  uint local_40;
  uint32 n;
  uint32 m;
  uint32 i;
  uint32 chksum;
  int32 byteswap;
  FILE *fh;
  char *pcStack_20;
  int32 dim_local;
  char *ldafile_local;
  feat_t *feat_local;
  
  fh._4_4_ = dim;
  pcStack_20 = ldafile;
  ldafile_local = (char *)feat;
  if (feat == (feat_t *)0x0) {
    __assert_fail("feat",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/lda.c"
                  ,0x44,"int32 feat_read_lda(feat_t *, const char *, int32)");
  }
  if (feat->n_stream == 1) {
    _chksum = fopen(ldafile,"rb");
    if (_chksum == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/lda.c"
                     ,0x4c,"Failed to open transform file \'%s\' for reading",pcStack_20);
      feat_local._4_4_ = -1;
    }
    else {
      iVar1 = bio_readhdr((FILE *)_chksum,&argval,(char ***)&outlda,(int32 *)&i);
      if (iVar1 < 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/lda.c"
                ,0x51,"Failed to read header from transform file \'%s\'\n",pcStack_20);
        fclose(_chksum);
        feat_local._4_4_ = -1;
      }
      else {
        for (n = 0; argval[n] != (char *)0x0; n = n + 1) {
          iVar2 = strcmp(argval[n],"version");
          if ((iVar2 == 0) && (iVar2 = strcmp((char *)outlda[n],"0.1"), iVar2 != 0)) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/lda.c"
                    ,0x5a,"%s: Version mismatch: %s, expecting %s\n",pcStack_20,outlda[n],"0.1");
          }
        }
        bio_hdrarg_free(argval,(char **)outlda);
        outlda = (void ***)0x0;
        argval = (char **)0x0;
        m = 0;
        if (*(long *)(ldafile_local + 0x80) != 0) {
          ckd_free_3d(*(void **)(ldafile_local + 0x80));
        }
        iVar1 = bio_fread_3d(&local_60,4,(uint32 *)(ldafile_local + 0x88),&local_40,
                             (uint32 *)((long)&argname + 4),(FILE *)_chksum,i,&m);
        if (iVar1 < 0) {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/lda.c"
                         ,0x6d,"%s: bio_fread_3d(lda) failed\n",pcStack_20);
          fclose(_chksum);
          feat_local._4_4_ = -1;
        }
        else {
          *(void ****)(ldafile_local + 0x80) = local_60;
          fclose(_chksum);
          if (argname._4_4_ != **(uint **)(ldafile_local + 0x18)) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/lda.c"
                    ,0x7f,"LDA matrix dimension %d doesn\'t match feature stream size %d\n",
                    (ulong)argname._4_4_,(ulong)**(uint **)(ldafile_local + 0x18));
            exit(1);
          }
          if ((local_40 < fh._4_4_) || ((int)fh._4_4_ < 1)) {
            fh._4_4_ = local_40;
          }
          *(uint *)(ldafile_local + 0x8c) = fh._4_4_;
          feat_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/lda.c"
            ,0x47,"LDA incompatible with multi-stream features (n_stream = %d)\n",
            (ulong)(uint)feat->n_stream);
    feat_local._4_4_ = -1;
  }
  return feat_local._4_4_;
}

Assistant:

int32
feat_read_lda(feat_t *feat, const char *ldafile, int32 dim)
{
    FILE *fh;
    int32 byteswap;
    uint32 chksum, i, m, n;
    char **argname, **argval;

    assert(feat);
    if (feat->n_stream != 1) {
        E_ERROR("LDA incompatible with multi-stream features (n_stream = %d)\n",
                feat->n_stream);
        return -1;
    }

    if ((fh = fopen(ldafile, "rb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open transform file '%s' for reading", ldafile);
        return -1;
    }

    if (bio_readhdr(fh, &argname, &argval, &byteswap) < 0) {
        E_ERROR("Failed to read header from transform file '%s'\n", ldafile);
        fclose(fh);
        return -1;
    }

    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
            if (strcmp(argval[i], MATRIX_FILE_VERSION) != 0)
                E_WARN("%s: Version mismatch: %s, expecting %s\n",
                       ldafile, argval[i], MATRIX_FILE_VERSION);
        }
    }

    bio_hdrarg_free(argname, argval);
    argname = argval = NULL;

    chksum = 0;

    if (feat->lda)
        ckd_free_3d((void ***)feat->lda);

    {
        /* Use a temporary variable to avoid strict-aliasing problems. */
        void ***outlda;

        if (bio_fread_3d(&outlda, sizeof(float32),
                         &feat->n_lda, &m, &n,
                         fh, byteswap, &chksum) < 0) {
            E_ERROR_SYSTEM("%s: bio_fread_3d(lda) failed\n", ldafile);
            fclose(fh);
            return -1;
        }
        feat->lda = (void *)outlda;
    }
    fclose(fh);
    
#ifdef FIXED_POINT
    /* FIXME: This is a fragile hack that depends on mfcc_t and
     * float32 being the same size (which they are, but...) */
    for (i = 0; i < feat->n_lda * m * n; ++i) {
        feat->lda[0][0][i] = FLOAT2MFCC(((float *)feat->lda[0][0])[i]);
    }
#endif

    /* Note that SphinxTrain stores the eigenvectors as row vectors. */
    if (n != feat->stream_len[0])
	E_FATAL("LDA matrix dimension %d doesn't match feature stream size %d\n", n, feat->stream_len[0]);
    
    /* Override dim from file if it is 0 or greater than m. */
    if (dim > m || dim <= 0) {
        dim = m;
    }
    feat->out_dim = dim;

    return 0;
}